

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_allocate_node_records
          (Impl *this,SPIRVModule *param_1,bool per_thread)

{
  Builder *pBVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  _Head_base<0UL,_spv::Instruction_*,_false> _Var13;
  undefined8 uVar14;
  undefined1 auVar15 [12];
  Id IVar16;
  Op OVar17;
  Function *pFVar18;
  Block *pBVar19;
  Block *pBVar20;
  undefined7 in_register_00000011;
  Id IVar21;
  char cVar22;
  char *name;
  Id uint_type;
  _Head_base<0UL,_spv::Instruction_*,_false> local_298;
  Id local_28c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_288;
  _Head_base<0UL,_spv::Instruction_*,_false> local_280;
  undefined1 local_278 [16];
  undefined8 local_268;
  Function *local_258;
  _Head_base<0UL,_spv::Instruction_*,_false> local_250;
  undefined1 local_248 [12];
  undefined1 auStack_23c [4];
  pointer local_238;
  Builder *local_228;
  _Head_base<0UL,_spv::Instruction_*,_false> local_220;
  _Head_base<0UL,_spv::Instruction_*,_false> local_218;
  _Head_base<0UL,_spv::Instruction_*,_false> local_210;
  _Head_base<0UL,_spv::Instruction_*,_false> local_208;
  _Head_base<0UL,_spv::Instruction_*,_false> local_200;
  Id local_1f8;
  Id bool_type;
  long local_1f0;
  Block *local_1e8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1e0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1d8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1d0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1c8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1c0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1b8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1b0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1a8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_1a0;
  Id local_194;
  Block *entry;
  Block *local_188;
  Block *local_180;
  _Head_base<0UL,_spv::Instruction_*,_false> local_178;
  Id local_170;
  undefined4 local_16c;
  ulong local_168;
  Block *local_160;
  _Head_base<0UL,_spv::Instruction_*,_false> local_158;
  _Head_base<0UL,_spv::Instruction_*,_false> local_150;
  _Head_base<0UL,_spv::Instruction_*,_false> local_148;
  _Head_base<0UL,_spv::Instruction_*,_false> local_140;
  _Head_base<0UL,_spv::Instruction_*,_false> local_138;
  _Head_base<0UL,_spv::Instruction_*,_false> local_130;
  _Head_base<0UL,_spv::Instruction_*,_false> local_128;
  _Head_base<0UL,_spv::Instruction_*,_false> local_120;
  _Head_base<0UL,_spv::Instruction_*,_false> local_118;
  _Head_base<0UL,_spv::Instruction_*,_false> local_110;
  _Head_base<0UL,_spv::Instruction_*,_false> local_108;
  _Head_base<0UL,_spv::Instruction_*,_false> local_100;
  _Head_base<0UL,_spv::Instruction_*,_false> local_f8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_f0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_e8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_e0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_d8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_d0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_c8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_c0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_b8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_b0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_a8;
  _Head_base<0UL,_spv::Instruction_*,_false> local_a0;
  _Head_base<0UL,_spv::Instruction_*,_false> local_98;
  _Head_base<0UL,_spv::Instruction_*,_false> local_90;
  _Head_base<0UL,_spv::Instruction_*,_false> local_88;
  Id IStack_80;
  Id IStack_7c;
  Id IStack_78;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  local_168 = (ulong)!per_thread;
  IVar16 = (&this->allocate_thread_node_records_call_id)[local_168];
  if (IVar16 == 0) {
    pBVar1 = &this->builder;
    local_160 = (this->builder).buildPoint;
    entry = (Block *)0x0;
    bool_type = spv::Builder::makeBoolType(pBVar1);
    IVar16 = spv::Builder::makeUintType(pBVar1,0x20);
    uint_type = IVar16;
    local_88._M_head_impl._0_4_ = spv::Builder::makeUintType(pBVar1,0x40);
    name = "AllocateGroupNodeRecords";
    if (per_thread) {
      name = "AllocateThreadNodeRecords";
    }
    local_88._M_head_impl._4_4_ = IVar16;
    local_1f0 = CONCAT44(local_1f0._4_4_,(int)CONCAT71(in_register_00000011,per_thread));
    local_278 = (undefined1  [16])0x0;
    local_268 = 0;
    IStack_80 = IVar16;
    IStack_7c = IVar16;
    IStack_78 = IVar16;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)local_278,
               &local_88);
    _local_248 = (undefined1  [16])0x0;
    local_238 = (pointer)0x0;
    pFVar18 = spv::Builder::makeFunctionEntry
                        (pBVar1,DecorationMax,IVar16,name,(Vector<Id> *)local_278,
                         (vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                          *)local_248,&entry);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)local_248);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               local_278);
    spv::Builder::addName
              (pBVar1,(*(pFVar18->parameterInstructions).
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start)->resultId,"AtomicCountersBDA");
    spv::Builder::addName
              (pBVar1,(pFVar18->parameterInstructions).
                      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]->resultId,"NodeMetadataIndex");
    spv::Builder::addName
              (pBVar1,(pFVar18->parameterInstructions).
                      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[2]->resultId,"Count");
    spv::Builder::addName
              (pBVar1,(pFVar18->parameterInstructions).
                      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[3]->resultId,"Stride");
    spv::Builder::addName
              (pBVar1,(pFVar18->parameterInstructions).
                      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[4]->resultId,"AllocationOffset");
    if ((char)local_1f0 == '\0') {
      IVar16 = (pFVar18->parameterInstructions).
               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[2]->resultId;
      local_194 = 0;
    }
    else {
      spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniformBallot);
      spv::Builder::addCapability(pBVar1,CapabilityGroupNonUniformArithmetic);
      IVar16 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar16;
      local_248._0_4_ = IVar16;
      local_88._M_head_impl._0_4_ = 0x15d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)local_278,(uint *)local_248,&uint_type);
      uVar14 = local_278._0_8_;
      IVar16 = spv::Builder::makeUintConstant(pBVar1,3,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar16);
      spv::Instruction::addImmediateOperand((Instruction *)local_278._0_8_,0);
      spv::Instruction::addIdOperand
                ((Instruction *)local_278._0_8_,
                 (pFVar18->parameterInstructions).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]->resultId);
      IVar16 = *(Id *)(local_278._0_8_ + 8);
      local_90._M_head_impl = (Instruction *)local_278._0_8_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_278._8_8_;
      local_278 = auVar2 << 0x40;
      add_instruction(this,entry,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_90);
      if (local_90._M_head_impl != (Instruction *)0x0) {
        (*(local_90._M_head_impl)->_vptr_Instruction[1])();
      }
      local_90._M_head_impl = (Instruction *)0x0;
      local_194 = spv::Builder::createUndefined(pBVar1,uint_type);
      if ((long *)local_278._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_278._0_8_ + 8))();
      }
    }
    pBVar19 = (Block *)allocate_in_thread(0x78);
    IVar21 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar21;
    local_258 = pFVar18;
    spv::Block::Block(pBVar19,IVar21,pFVar18);
    IVar21 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar21;
    local_278._0_4_ = IVar21;
    local_248._0_4_ = 0xaa;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_88,(uint *)local_278,&bool_type);
    local_28c = IVar16;
    spv::Instruction::addIdOperand(local_88._M_head_impl,IVar16);
    _Var13._M_head_impl = local_88._M_head_impl;
    local_228 = pBVar1;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,0,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    local_1e8 = (Block *)CONCAT44(local_1e8._4_4_,(local_88._M_head_impl)->resultId);
    local_98._M_head_impl = local_88._M_head_impl;
    local_88._M_head_impl = (Instruction *)0x0;
    add_instruction(this,entry,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_98);
    if (local_98._M_head_impl != (Instruction *)0x0) {
      (*(local_98._M_head_impl)->_vptr_Instruction[1])();
    }
    local_98._M_head_impl = (Instruction *)0x0;
    pBVar20 = (Block *)allocate_in_thread(0x78);
    pFVar18 = local_258;
    IVar16 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar16;
    spv::Block::Block(pBVar20,IVar16,local_258);
    pBVar1 = local_228;
    (this->builder).buildPoint = entry;
    spv::Builder::createSelectionMerge(local_228,pBVar20,0);
    spv::Builder::createConditionalBranch(pBVar1,(Id)local_1e8,pBVar19,pBVar20);
    (this->builder).buildPoint = pBVar19;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,0,false);
    spv::Builder::makeReturn(pBVar1,false,IVar16);
    local_180 = (Block *)allocate_in_thread(0x78);
    IVar16 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar16;
    spv::Block::Block(local_180,IVar16,pFVar18);
    local_1e8 = (Block *)allocate_in_thread(0x78);
    IVar16 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar16;
    spv::Block::Block(local_1e8,IVar16,pFVar18);
    local_188 = pBVar20;
    if ((char)local_1f0 == '\0') {
      local_1f8 = create_variable(this,StorageClassWorkgroup,uint_type,
                                  "AllocateGroupNodeRecordsShared");
      IVar16 = get_builtin_shader_input(this,BuiltInLocalInvocationIndex);
      IVar21 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar21;
      local_248._0_4_ = IVar21;
      local_298._M_head_impl._0_4_ = 0x3d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)local_278,(uint *)local_248,&uint_type);
      spv::Instruction::addIdOperand((Instruction *)local_278._0_8_,IVar16);
      local_298._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = (Id)local_298._M_head_impl;
      local_280._M_head_impl._0_4_ = 0xaa;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)local_248,(uint *)&local_298,&bool_type);
      spv::Instruction::addIdOperand((Instruction *)local_248._0_8_,*(Id *)(local_278._0_8_ + 8));
      uVar14 = local_248._0_8_;
      IVar16 = spv::Builder::makeUintConstant(pBVar1,0,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar16);
      IVar16 = *(Id *)(local_248._0_8_ + 8);
      local_a8._M_head_impl = (Instruction *)local_278._0_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_278._8_8_;
      local_278 = auVar4 << 0x40;
      add_instruction(this,pBVar20,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_a8);
      if (local_a8._M_head_impl != (Instruction *)0x0) {
        (*(local_a8._M_head_impl)->_vptr_Instruction[1])();
      }
      local_a8._M_head_impl = (Instruction *)0x0;
      local_b0._M_head_impl = (Instruction *)local_248._0_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = stack0xfffffffffffffdc0;
      _local_248 = auVar5 << 0x40;
      add_instruction(this,local_188,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_b0);
      if (local_b0._M_head_impl != (Instruction *)0x0) {
        (*(local_b0._M_head_impl)->_vptr_Instruction[1])();
      }
      pFVar18 = local_258;
      local_b0._M_head_impl = (Instruction *)0x0;
      if ((pointer)local_248._0_8_ != (pointer)0x0) {
        (**(code **)(*(long *)local_248._0_8_ + 8))();
      }
      pBVar20 = local_188;
      if ((long *)local_278._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_278._0_8_ + 8))();
      }
    }
    else {
      IVar16 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar16;
      local_248._0_4_ = IVar16;
      local_298._M_head_impl._0_4_ = 0x14d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)local_278,(uint *)local_248,&bool_type);
      uVar14 = local_278._0_8_;
      IVar16 = spv::Builder::makeUintConstant(pBVar1,3,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar16);
      IVar16 = *(Id *)(local_278._0_8_ + 8);
      local_a0._M_head_impl = (Instruction *)local_278._0_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_278._8_8_;
      local_278 = auVar3 << 0x40;
      add_instruction(this,pBVar20,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_a0);
      if (local_a0._M_head_impl != (Instruction *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_Instruction[1])();
      }
      local_a0._M_head_impl = (Instruction *)0x0;
      if ((long *)local_278._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_278._0_8_ + 8))();
      }
      local_1f8 = 0;
    }
    pBVar19 = local_1e8;
    pBVar1 = local_228;
    (this->builder).buildPoint = pBVar20;
    spv::Builder::createSelectionMerge(local_228,local_1e8,0);
    pBVar20 = local_180;
    spv::Builder::createConditionalBranch(pBVar1,IVar16,local_180,pBVar19);
    (this->builder).buildPoint = pBVar20;
    OVar17 = (this->builder).uniqueId + OpUndef;
    (this->builder).uniqueId = OVar17;
    local_248._0_4_ = 0x84;
    local_278._0_4_ = OVar17;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_298,(uint *)local_278,&uint_type);
    spv::Instruction::addIdOperand(local_298._M_head_impl,local_28c);
    spv::Instruction::addIdOperand
              (local_298._M_head_impl,
               (pFVar18->parameterInstructions).
               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[3]->resultId);
    local_278._0_4_ = (this->builder).uniqueId + OpUndef;
    (this->builder).uniqueId = local_278._0_4_;
    local_248._0_4_ = 0x80;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_280,(uint *)local_278,&uint_type);
    spv::Instruction::addIdOperand(local_280._M_head_impl,(local_298._M_head_impl)->resultId);
    _Var13._M_head_impl = local_280._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,0xf,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    local_278._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = local_278._0_4_;
    local_248._0_4_ = 199;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_288,(uint *)local_278,&uint_type);
    spv::Instruction::addIdOperand(local_288._M_head_impl,(local_280._M_head_impl)->resultId);
    _Var13._M_head_impl = local_288._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,0xfffffff0,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    IVar16 = spv::Builder::makeRuntimeArray(pBVar1,uint_type);
    spv::Builder::addDecoration(pBVar1,IVar16,DecorationArrayStride,4);
    auVar15 = stack0xfffffffffffffdbc;
    local_248._4_4_ = uint_type;
    local_248._0_4_ = uint_type;
    auStack_23c = auVar15._8_4_;
    local_248._8_4_ = IVar16;
    local_278 = (undefined1  [16])0x0;
    local_268 = 0;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)local_278,
               (vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                *)local_248,
               (undefined1 *)
               ((long)&(((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                          *)local_248)->
                       super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + 4));
    IVar16 = spv::Builder::makeStructType(pBVar1,(Vector<Id> *)local_278,"NodeAtomics");
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               local_278);
    spv::Builder::addDecoration(pBVar1,IVar16,DecorationBlock,-1);
    spv::Builder::addMemberName(pBVar1,IVar16,0,"payloadCount");
    spv::Builder::addMemberName(pBVar1,IVar16,1,"fusedCount");
    spv::Builder::addMemberName(pBVar1,IVar16,2,"perNodeTotal");
    spv::Builder::addMemberDecoration(pBVar1,IVar16,0,DecorationOffset,0);
    spv::Builder::addMemberDecoration(pBVar1,IVar16,1,DecorationOffset,4);
    spv::Builder::addMemberDecoration(pBVar1,IVar16,2,DecorationOffset,8);
    IVar21 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar21;
    local_248._0_4_ = IVar21;
    local_220._M_head_impl._0_4_ =
         spv::Builder::makePointer(pBVar1,StorageClassPhysicalStorageBuffer,IVar16);
    local_250._M_head_impl._0_4_ = 0x7c;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)local_278,(uint *)local_248,(Op *)&local_220);
    spv::Instruction::addIdOperand
              ((Instruction *)local_278._0_8_,
               (*(local_258->parameterInstructions).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->resultId);
    local_220._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_220._M_head_impl;
    local_250._M_head_impl._0_4_ =
         spv::Builder::makePointer(pBVar1,StorageClassPhysicalStorageBuffer,uint_type);
    local_1c8._M_head_impl._0_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)local_248,(uint *)&local_220,(Op *)&local_250);
    spv::Instruction::addIdOperand((Instruction *)local_248._0_8_,*(Id *)(local_278._0_8_ + 8));
    uVar14 = local_248._0_8_;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,0,false);
    spv::Instruction::addIdOperand((Instruction *)uVar14,IVar16);
    local_250._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_250._M_head_impl;
    local_1c8._M_head_impl._0_4_ =
         spv::Builder::makePointer(pBVar1,StorageClassPhysicalStorageBuffer,uint_type);
    local_200._M_head_impl._0_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_220,(uint *)&local_250,(Op *)&local_1c8);
    spv::Instruction::addIdOperand(local_220._M_head_impl,*(Id *)(local_278._0_8_ + 8));
    _Var13._M_head_impl = local_220._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,1,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    local_1c8._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_1c8._M_head_impl;
    local_200._M_head_impl._0_4_ = 0xea;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_250,(uint *)&local_1c8,&uint_type);
    spv::Instruction::addIdOperand(local_250._M_head_impl,*(Id *)(local_248._0_8_ + 8));
    _Var13._M_head_impl = local_250._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,1,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    _Var13._M_head_impl = local_250._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,0,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    spv::Instruction::addIdOperand(local_250._M_head_impl,(local_288._M_head_impl)->resultId);
    IVar16 = (local_258->parameterInstructions).
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1]->resultId;
    local_200._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_200._M_head_impl;
    local_170 = IVar16;
    local_208._M_head_impl._0_4_ =
         spv::Builder::makePointer(pBVar1,StorageClassPhysicalStorageBuffer,uint_type);
    local_210._M_head_impl._0_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_1c8,(uint *)&local_200,(Op *)&local_208);
    spv::Instruction::addIdOperand(local_1c8._M_head_impl,*(Id *)(local_278._0_8_ + 8));
    _Var13._M_head_impl = local_1c8._M_head_impl;
    IVar21 = spv::Builder::makeUintConstant(pBVar1,2,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar21);
    spv::Instruction::addIdOperand(local_1c8._M_head_impl,IVar16);
    local_208._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_208._M_head_impl;
    local_210._M_head_impl._0_4_ = 0xea;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_200,(uint *)&local_208,&uint_type);
    spv::Instruction::addIdOperand(local_200._M_head_impl,(local_1c8._M_head_impl)->resultId);
    _Var13._M_head_impl = local_200._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,1,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    _Var13._M_head_impl = local_200._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,0,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    IVar16 = local_28c;
    spv::Instruction::addIdOperand(local_200._M_head_impl,local_28c);
    local_210._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_210._M_head_impl;
    local_1d0._M_head_impl._0_4_ = 0xc4;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_208,(uint *)&local_210,&uint_type);
    spv::Instruction::addIdOperand(local_208._M_head_impl,local_170);
    _Var13._M_head_impl = local_208._M_head_impl;
    IVar21 = spv::Builder::makeUintConstant(pBVar1,8,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar21);
    local_1d0._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_1d0._M_head_impl;
    local_1a0._M_head_impl._0_4_ = 0x82;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_210,(uint *)&local_1d0,&uint_type);
    spv::Instruction::addIdOperand(local_210._M_head_impl,IVar16);
    _Var13._M_head_impl = local_210._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,1,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    local_1a0._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_1a0._M_head_impl;
    local_1a8._M_head_impl._0_4_ = 0xc5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_1d0,(uint *)&local_1a0,&uint_type);
    spv::Instruction::addIdOperand(local_1d0._M_head_impl,(local_208._M_head_impl)->resultId);
    spv::Instruction::addIdOperand(local_1d0._M_head_impl,(local_210._M_head_impl)->resultId);
    local_1a8._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_1a8._M_head_impl;
    local_218._M_head_impl._0_4_ = 0xe8;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_1a0,(uint *)&local_1a8,&uint_type);
    spv::Instruction::addIdOperand(local_1a0._M_head_impl,(local_220._M_head_impl)->resultId);
    _Var13._M_head_impl = local_1a0._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,1,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    _Var13._M_head_impl = local_1a0._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,0,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    local_218._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_218._M_head_impl;
    local_1d8._M_head_impl._0_4_ = 0x84;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_1a8,(uint *)&local_218,&uint_type);
    _Var13._M_head_impl = local_1a8._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,2,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    spv::Instruction::addIdOperand(local_1a8._M_head_impl,(local_1a0._M_head_impl)->resultId);
    local_1d8._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_1d8._M_head_impl;
    local_1b0._M_head_impl._0_4_ = 0x80;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_218,(uint *)&local_1d8,&uint_type);
    spv::Instruction::addIdOperand
              (local_218._M_head_impl,
               (local_258->parameterInstructions).
               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[4]->resultId);
    spv::Instruction::addIdOperand(local_218._M_head_impl,(local_1a8._M_head_impl)->resultId);
    local_1b0._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_1b0._M_head_impl;
    local_1b8._M_head_impl._0_4_ = 0x80;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_1d8,(uint *)&local_1b0,&uint_type);
    spv::Instruction::addIdOperand(local_1d8._M_head_impl,(local_218._M_head_impl)->resultId);
    _Var13._M_head_impl = local_1d8._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,1,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    local_1b8._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_1b8._M_head_impl;
    local_1c0._M_head_impl._0_4_ =
         spv::Builder::makePointer(pBVar1,StorageClassPhysicalStorageBuffer,uint_type);
    local_1e0._M_head_impl._0_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_1b0,(uint *)&local_1b8,(Op *)&local_1c0);
    spv::Instruction::addIdOperand(local_1b0._M_head_impl,*(Id *)(local_278._0_8_ + 8));
    _Var13._M_head_impl = local_1b0._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,2,false);
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    spv::Instruction::addIdOperand(local_1b0._M_head_impl,(local_218._M_head_impl)->resultId);
    local_1c0._M_head_impl._0_4_ = 0x3e;
    std::make_unique<spv::Instruction,spv::Op>((Op *)&local_1b8);
    spv::Instruction::addIdOperand(local_1b8._M_head_impl,(local_1b0._M_head_impl)->resultId);
    spv::Instruction::addIdOperand(local_1b8._M_head_impl,(local_1d0._M_head_impl)->resultId);
    spv::Instruction::addImmediateOperand(local_1b8._M_head_impl,2);
    spv::Instruction::addImmediateOperand(local_1b8._M_head_impl,8);
    local_1e0._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = (Id)local_1e0._M_head_impl;
    local_178._M_head_impl._0_4_ =
         spv::Builder::makePointer(pBVar1,StorageClassPhysicalStorageBuffer,uint_type);
    local_16c = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_1c0,(uint *)&local_1e0,(Op *)&local_178);
    spv::Instruction::addIdOperand(local_1c0._M_head_impl,*(Id *)(local_278._0_8_ + 8));
    _Var13._M_head_impl = local_1c0._M_head_impl;
    IVar16 = spv::Builder::makeUintConstant(pBVar1,2,false);
    pBVar19 = local_180;
    spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
    spv::Instruction::addIdOperand(local_1c0._M_head_impl,(local_1d8._M_head_impl)->resultId);
    local_178._M_head_impl._0_4_ = 0x3e;
    std::make_unique<spv::Instruction,spv::Op>((Op *)&local_1e0);
    spv::Instruction::addIdOperand(local_1e0._M_head_impl,(local_1c0._M_head_impl)->resultId);
    spv::Instruction::addIdOperand(local_1e0._M_head_impl,(local_250._M_head_impl)->resultId);
    spv::Instruction::addImmediateOperand(local_1e0._M_head_impl,2);
    spv::Instruction::addImmediateOperand(local_1e0._M_head_impl,4);
    local_28c = (local_250._M_head_impl)->resultId;
    local_b8._M_head_impl = local_298._M_head_impl;
    local_298._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_b8);
    if (local_b8._M_head_impl != (Instruction *)0x0) {
      (*(local_b8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_b8._M_head_impl = (Instruction *)0x0;
    local_c0._M_head_impl = local_280._M_head_impl;
    local_280._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_c0);
    cVar22 = (char)local_1f0;
    if (local_c0._M_head_impl != (Instruction *)0x0) {
      (*(local_c0._M_head_impl)->_vptr_Instruction[1])();
    }
    local_c0._M_head_impl = (Instruction *)0x0;
    local_c8._M_head_impl = local_288._M_head_impl;
    local_288._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_c8);
    pFVar18 = local_258;
    if (local_c8._M_head_impl != (Instruction *)0x0) {
      (*(local_c8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_c8._M_head_impl = (Instruction *)0x0;
    local_d0._M_head_impl = (Instruction *)local_278._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_278._8_8_;
    local_278 = auVar6 << 0x40;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_d0);
    if (local_d0._M_head_impl != (Instruction *)0x0) {
      (*(local_d0._M_head_impl)->_vptr_Instruction[1])();
    }
    local_d0._M_head_impl = (Instruction *)0x0;
    local_d8._M_head_impl = (Instruction *)local_248._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = stack0xfffffffffffffdc0;
    _local_248 = auVar7 << 0x40;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_d8);
    if (local_d8._M_head_impl != (Instruction *)0x0) {
      (*(local_d8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_d8._M_head_impl = (Instruction *)0x0;
    local_e0._M_head_impl = local_220._M_head_impl;
    local_220._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_e0);
    if (local_e0._M_head_impl != (Instruction *)0x0) {
      (*(local_e0._M_head_impl)->_vptr_Instruction[1])();
    }
    local_e0._M_head_impl = (Instruction *)0x0;
    local_e8._M_head_impl = local_250._M_head_impl;
    local_250._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_e8);
    if (local_e8._M_head_impl != (Instruction *)0x0) {
      (*(local_e8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_e8._M_head_impl = (Instruction *)0x0;
    local_f0._M_head_impl = local_1c8._M_head_impl;
    local_1c8._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_f0);
    if (local_f0._M_head_impl != (Instruction *)0x0) {
      (*(local_f0._M_head_impl)->_vptr_Instruction[1])();
    }
    local_f0._M_head_impl = (Instruction *)0x0;
    local_f8._M_head_impl = local_208._M_head_impl;
    local_208._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_f8);
    if (local_f8._M_head_impl != (Instruction *)0x0) {
      (*(local_f8._M_head_impl)->_vptr_Instruction[1])();
    }
    local_f8._M_head_impl = (Instruction *)0x0;
    local_100._M_head_impl = local_210._M_head_impl;
    local_210._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_100);
    if (local_100._M_head_impl != (Instruction *)0x0) {
      (*(local_100._M_head_impl)->_vptr_Instruction[1])();
    }
    local_100._M_head_impl = (Instruction *)0x0;
    local_108._M_head_impl = local_1d0._M_head_impl;
    local_1d0._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_108);
    if (local_108._M_head_impl != (Instruction *)0x0) {
      (*(local_108._M_head_impl)->_vptr_Instruction[1])();
    }
    local_108._M_head_impl = (Instruction *)0x0;
    local_110._M_head_impl = local_1a0._M_head_impl;
    local_1a0._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_110);
    if (local_110._M_head_impl != (Instruction *)0x0) {
      (*(local_110._M_head_impl)->_vptr_Instruction[1])();
    }
    local_110._M_head_impl = (Instruction *)0x0;
    local_118._M_head_impl = local_1a8._M_head_impl;
    local_1a8._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_118);
    if (local_118._M_head_impl != (Instruction *)0x0) {
      (*(local_118._M_head_impl)->_vptr_Instruction[1])();
    }
    local_118._M_head_impl = (Instruction *)0x0;
    local_120._M_head_impl = local_200._M_head_impl;
    local_200._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_120);
    if (local_120._M_head_impl != (Instruction *)0x0) {
      (*(local_120._M_head_impl)->_vptr_Instruction[1])();
    }
    local_120._M_head_impl = (Instruction *)0x0;
    local_128._M_head_impl = local_218._M_head_impl;
    local_218._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_128);
    if (local_128._M_head_impl != (Instruction *)0x0) {
      (*(local_128._M_head_impl)->_vptr_Instruction[1])();
    }
    local_128._M_head_impl = (Instruction *)0x0;
    local_130._M_head_impl = local_1d8._M_head_impl;
    local_1d8._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_130);
    if (local_130._M_head_impl != (Instruction *)0x0) {
      (*(local_130._M_head_impl)->_vptr_Instruction[1])();
    }
    local_130._M_head_impl = (Instruction *)0x0;
    local_138._M_head_impl = local_1b0._M_head_impl;
    local_1b0._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_138);
    if (local_138._M_head_impl != (Instruction *)0x0) {
      (*(local_138._M_head_impl)->_vptr_Instruction[1])();
    }
    local_138._M_head_impl = (Instruction *)0x0;
    local_140._M_head_impl = local_1b8._M_head_impl;
    local_1b8._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_140);
    if (local_140._M_head_impl != (Instruction *)0x0) {
      (*(local_140._M_head_impl)->_vptr_Instruction[1])();
    }
    local_140._M_head_impl = (Instruction *)0x0;
    local_148._M_head_impl = local_1c0._M_head_impl;
    local_1c0._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_148);
    if (local_148._M_head_impl != (Instruction *)0x0) {
      (*(local_148._M_head_impl)->_vptr_Instruction[1])();
    }
    local_148._M_head_impl = (Instruction *)0x0;
    local_150._M_head_impl = local_1e0._M_head_impl;
    local_1e0._M_head_impl = (Instruction *)0x0;
    add_instruction(this,pBVar19,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_150);
    if (local_150._M_head_impl != (Instruction *)0x0) {
      (*(local_150._M_head_impl)->_vptr_Instruction[1])();
    }
    local_150._M_head_impl = (Instruction *)0x0;
    if (cVar22 == '\0') {
      local_16c = 0x3e;
      std::make_unique<spv::Instruction,spv::Op>((Op *)&local_178);
      spv::Instruction::addIdOperand(local_178._M_head_impl,local_1f8);
      spv::Instruction::addIdOperand(local_178._M_head_impl,local_28c);
      local_158._M_head_impl = local_178._M_head_impl;
      local_178._M_head_impl = (Instruction *)0x0;
      add_instruction(this,pBVar19,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_158);
      if (local_158._M_head_impl != (Instruction *)0x0) {
        (*(local_158._M_head_impl)->_vptr_Instruction[1])();
      }
      local_158._M_head_impl = (Instruction *)0x0;
      if (local_178._M_head_impl != (Instruction *)0x0) {
        (*(local_178._M_head_impl)->_vptr_Instruction[1])();
      }
      cVar22 = (char)local_1f0;
    }
    spv::Builder::createBranch(local_228,local_1e8);
    if (local_1e0._M_head_impl != (Instruction *)0x0) {
      (*(local_1e0._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_1c0._M_head_impl != (Instruction *)0x0) {
      (*(local_1c0._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_1b8._M_head_impl != (Instruction *)0x0) {
      (*(local_1b8._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_1b0._M_head_impl != (Instruction *)0x0) {
      (*(local_1b0._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_1d8._M_head_impl != (Instruction *)0x0) {
      (*(local_1d8._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_218._M_head_impl != (Instruction *)0x0) {
      (*(local_218._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_1a8._M_head_impl != (Instruction *)0x0) {
      (*(local_1a8._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_1a0._M_head_impl != (Instruction *)0x0) {
      (*(local_1a0._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_1d0._M_head_impl != (Instruction *)0x0) {
      (*(local_1d0._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_210._M_head_impl != (Instruction *)0x0) {
      (*(local_210._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_208._M_head_impl != (Instruction *)0x0) {
      (*(local_208._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_200._M_head_impl != (Instruction *)0x0) {
      (*(local_200._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_1c8._M_head_impl != (Instruction *)0x0) {
      (*(local_1c8._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_250._M_head_impl != (Instruction *)0x0) {
      (*(local_250._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_220._M_head_impl != (Instruction *)0x0) {
      (*(local_220._M_head_impl)->_vptr_Instruction[1])();
    }
    if ((pointer)local_248._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_248._0_8_ + 8))();
    }
    if ((long *)local_278._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_278._0_8_ + 8))();
    }
    if (local_288._M_head_impl != (Instruction *)0x0) {
      (*(local_288._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_280._M_head_impl != (Instruction *)0x0) {
      (*(local_280._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_298._M_head_impl != (Instruction *)0x0) {
      (*(local_298._M_head_impl)->_vptr_Instruction[1])();
    }
    pBVar19 = local_1e8;
    local_1f0 = local_168 * 4 + 0xdcc;
    (this->builder).buildPoint = local_1e8;
    if (cVar22 == '\0') {
      local_248._0_4_ = 0xe0;
      std::make_unique<spv::Instruction,spv::Op>((Op *)local_278);
      pBVar1 = local_228;
      uVar14 = local_278._0_8_;
      IVar16 = spv::Builder::makeUintConstant(local_228,2,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar16);
      uVar14 = local_278._0_8_;
      IVar16 = spv::Builder::makeUintConstant(pBVar1,2,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar16);
      uVar14 = local_278._0_8_;
      IVar16 = spv::Builder::makeUintConstant(pBVar1,0x108,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar16);
      local_38._M_head_impl = (Instruction *)local_278._0_8_;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_278._8_8_;
      local_278 = auVar10 << 0x40;
      add_instruction(this,pBVar19,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_38);
      if (local_38._M_head_impl != (Instruction *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Instruction[1])();
      }
      if ((long *)local_278._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_278._0_8_ + 8))();
      }
      IVar16 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar16;
      local_248._0_4_ = IVar16;
      local_298._M_head_impl._0_4_ = 0x3d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)local_278,(uint *)local_248,&uint_type);
      spv::Instruction::addIdOperand((Instruction *)local_278._0_8_,local_1f8);
      IVar16 = *(Id *)(local_278._0_8_ + 8);
      local_68._M_head_impl = (Instruction *)local_278._0_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_278._8_8_;
      local_278 = auVar11 << 0x40;
      add_instruction(this,pBVar19,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_68);
      if (local_68._M_head_impl != (Instruction *)0x0) {
        (*(local_68._M_head_impl)->_vptr_Instruction[1])();
      }
      if ((long *)local_278._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_278._0_8_ + 8))();
      }
      local_248._0_4_ = 0xe0;
      std::make_unique<spv::Instruction,spv::Op>((Op *)local_278);
      pBVar1 = local_228;
      uVar14 = local_278._0_8_;
      IVar21 = spv::Builder::makeUintConstant(local_228,2,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar21);
      uVar14 = local_278._0_8_;
      IVar21 = spv::Builder::makeUintConstant(pBVar1,2,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar21);
      uVar14 = local_278._0_8_;
      IVar21 = spv::Builder::makeUintConstant(pBVar1,0x108,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar21);
      local_70._M_head_impl = (Instruction *)local_278._0_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_278._8_8_;
      local_278 = auVar12 << 0x40;
      add_instruction(this,local_1e8,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_70);
      if (local_70._M_head_impl != (Instruction *)0x0) {
        (*(local_70._M_head_impl)->_vptr_Instruction[1])();
      }
      pFVar18 = local_258;
    }
    else {
      local_248._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = local_248._0_4_;
      local_298._M_head_impl._0_4_ = 0x15d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)local_278,(uint *)local_248,&uint_type);
      uVar14 = local_278._0_8_;
      IVar16 = spv::Builder::makeUintConstant(local_228,3,false);
      spv::Instruction::addIdOperand((Instruction *)uVar14,IVar16);
      spv::Instruction::addImmediateOperand((Instruction *)local_278._0_8_,2);
      spv::Instruction::addIdOperand
                ((Instruction *)local_278._0_8_,
                 (pFVar18->parameterInstructions).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]->resultId);
      local_298._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = (Id)local_298._M_head_impl;
      local_280._M_head_impl._0_4_ = 0xf5;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)local_248,(uint *)&local_298,&uint_type);
      spv::Instruction::addIdOperand((Instruction *)local_248._0_8_,local_28c);
      spv::Instruction::addIdOperand
                ((Instruction *)local_248._0_8_,
                 *(Id *)((long)(((local_180->instructions).
                                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t + 8));
      spv::Instruction::addIdOperand((Instruction *)local_248._0_8_,local_194);
      spv::Instruction::addIdOperand
                ((Instruction *)local_248._0_8_,
                 *(Id *)((long)(((local_188->instructions).
                                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t + 8));
      local_280._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = (Id)local_280._M_head_impl;
      local_288._M_head_impl._0_4_ = 0x152;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_298,(uint *)&local_280,&uint_type);
      _Var13._M_head_impl = local_298._M_head_impl;
      IVar16 = spv::Builder::makeUintConstant(local_228,3,false);
      spv::Instruction::addIdOperand(_Var13._M_head_impl,IVar16);
      spv::Instruction::addIdOperand(local_298._M_head_impl,*(Id *)(local_248._0_8_ + 8));
      local_288._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = (Id)local_288._M_head_impl;
      local_220._M_head_impl._0_4_ = 0x84;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_280,(uint *)&local_288,&uint_type);
      spv::Instruction::addIdOperand(local_280._M_head_impl,*(Id *)(local_278._0_8_ + 8));
      spv::Instruction::addIdOperand
                (local_280._M_head_impl,
                 (local_258->parameterInstructions).
                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[3]->resultId);
      local_220._M_head_impl._0_4_ = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = (Id)local_220._M_head_impl;
      local_250._M_head_impl._0_4_ = 0x80;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_288,(uint *)&local_220,&uint_type);
      spv::Instruction::addIdOperand(local_288._M_head_impl,(local_298._M_head_impl)->resultId);
      spv::Instruction::addIdOperand(local_288._M_head_impl,(local_280._M_head_impl)->resultId);
      IVar16 = (local_288._M_head_impl)->resultId;
      local_40._M_head_impl = (Instruction *)local_248._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = stack0xfffffffffffffdc0;
      _local_248 = auVar8 << 0x40;
      add_instruction(this,pBVar19,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_40);
      if (local_40._M_head_impl != (Instruction *)0x0) {
        (*(local_40._M_head_impl)->_vptr_Instruction[1])();
      }
      local_48._M_head_impl = local_298._M_head_impl;
      local_298._M_head_impl = (Instruction *)0x0;
      add_instruction(this,pBVar19,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_48);
      if (local_48._M_head_impl != (Instruction *)0x0) {
        (*(local_48._M_head_impl)->_vptr_Instruction[1])();
      }
      local_50._M_head_impl = (Instruction *)local_278._0_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_278._8_8_;
      local_278 = auVar9 << 0x40;
      add_instruction(this,pBVar19,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_50);
      pFVar18 = local_258;
      if (local_50._M_head_impl != (Instruction *)0x0) {
        (*(local_50._M_head_impl)->_vptr_Instruction[1])();
      }
      local_58._M_head_impl = local_280._M_head_impl;
      local_280._M_head_impl = (Instruction *)0x0;
      add_instruction(this,pBVar19,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_58);
      if (local_58._M_head_impl != (Instruction *)0x0) {
        (*(local_58._M_head_impl)->_vptr_Instruction[1])();
      }
      local_60._M_head_impl = local_288._M_head_impl;
      local_288._M_head_impl = (Instruction *)0x0;
      add_instruction(this,pBVar19,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_60);
      if (local_60._M_head_impl != (Instruction *)0x0) {
        (*(local_60._M_head_impl)->_vptr_Instruction[1])();
      }
      if (local_288._M_head_impl != (Instruction *)0x0) {
        (*(local_288._M_head_impl)->_vptr_Instruction[1])();
      }
      if (local_280._M_head_impl != (Instruction *)0x0) {
        (*(local_280._M_head_impl)->_vptr_Instruction[1])();
      }
      if (local_298._M_head_impl != (Instruction *)0x0) {
        (*(local_298._M_head_impl)->_vptr_Instruction[1])();
      }
      if ((pointer)local_248._0_8_ != (pointer)0x0) {
        (**(code **)(*(long *)local_248._0_8_ + 8))();
      }
    }
    if ((long *)local_278._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_278._0_8_ + 8))();
    }
    spv::Builder::makeReturn(local_228,false,IVar16);
    (this->builder).buildPoint = local_160;
    IVar16 = (pFVar18->functionInstruction).resultId;
    *(Id *)((long)&(this->super_BlockEmissionInterface)._vptr_BlockEmissionInterface + local_1f0) =
         IVar16;
    if (local_88._M_head_impl != (Instruction *)0x0) {
      (*(local_88._M_head_impl)->_vptr_Instruction[1])();
    }
  }
  return IVar16;
}

Assistant:

spv::Id SPIRVModule::Impl::build_allocate_node_records(SPIRVModule &, bool per_thread)
{
	auto &call_id = per_thread ? allocate_thread_node_records_call_id : allocate_group_node_records_call_id;
	if (call_id)
		return call_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uint64_type = builder.makeUintType(64);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uint_type,
	                                       per_thread ? "AllocateThreadNodeRecords" : "AllocateGroupNodeRecords",
	                                       { uint64_type, uint_type, uint_type, uint_type, uint_type },
	                                       {}, &entry);

	builder.addName(func->getParamId(0), "AtomicCountersBDA");
	builder.addName(func->getParamId(1), "NodeMetadataIndex");
	builder.addName(func->getParamId(2), "Count");
	builder.addName(func->getParamId(3), "Stride");
	builder.addName(func->getParamId(4), "AllocationOffset");

	spv::Id total_count_id;
	spv::Id phi_undefined_id = 0;

	if (per_thread)
	{
		// Do this on a per-wave basis. The node metadata index can be divergent, and we need to consider
		// that the outer function is a waterfall loop.
		builder.addCapability(spv::CapabilityGroupNonUniformBallot);
		builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);

		auto counts_total =
		    std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformIAdd);
		counts_total->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		counts_total->addImmediateOperand(spv::GroupOperationReduce);
		counts_total->addIdOperand(func->getParamId(2));

		total_count_id = counts_total->getResultId();
		add_instruction(entry, std::move(counts_total));

		phi_undefined_id = builder.createUndefined(uint_type);
	}
	else
	{
		total_count_id = func->getParamId(2);
	}

	auto *return_block = new spv::Block(builder.getUniqueId(), *func);
	auto check_empty = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
	check_empty->addIdOperand(total_count_id);
	check_empty->addIdOperand(builder.makeUintConstant(0));
	spv::Id return_early_cond_id = check_empty->getResultId();
	add_instruction(entry, std::move(check_empty));

	auto *reconverge_block = new spv::Block(builder.getUniqueId(), *func);
	builder.setBuildPoint(entry);
	builder.createSelectionMerge(reconverge_block, 0);
	builder.createConditionalBranch(return_early_cond_id, return_block, reconverge_block);
	builder.setBuildPoint(return_block);
	builder.makeReturn(false, builder.makeUintConstant(0));

	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);

	spv::Id shared_id = 0;
	if (!per_thread)
		shared_id = create_variable(spv::StorageClassWorkgroup, uint_type, "AllocateGroupNodeRecordsShared");

	spv::Id is_first_lane_id;

	if (per_thread)
	{
		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformElect);
		is_first_lane->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		is_first_lane_id = is_first_lane->getResultId();
		add_instruction(reconverge_block, std::move(is_first_lane));
	}
	else
	{
		spv::Id local_invocation_index = get_builtin_shader_input(spv::BuiltInLocalInvocationIndex);
		auto load_local_index = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_local_index->addIdOperand(local_invocation_index);

		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
		is_first_lane->addIdOperand(load_local_index->getResultId());
		is_first_lane->addIdOperand(builder.makeUintConstant(0));
		is_first_lane_id = is_first_lane->getResultId();
		add_instruction(reconverge_block, std::move(load_local_index));
		add_instruction(reconverge_block, std::move(is_first_lane));
	}

	builder.setBuildPoint(reconverge_block);
	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(is_first_lane_id, body_block, merge_block);

	spv::Id payload_offset_id;
	builder.setBuildPoint(body_block);
	{
		// Compute required payload bytes to allocate, and align.
		auto mul_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		mul_op->addIdOperand(total_count_id);
		mul_op->addIdOperand(func->getParamId(3));

		auto add_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		add_op->addIdOperand(mul_op->getResultId());
		add_op->addIdOperand(builder.makeUintConstant(15));

		auto and_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseAnd);
		and_op->addIdOperand(add_op->getResultId());
		and_op->addIdOperand(builder.makeUintConstant(~15u));

		spv::Id uint_array_type = builder.makeRuntimeArray(uint_type);
		builder.addDecoration(uint_array_type, spv::DecorationArrayStride, 4);
		spv::Id struct_type_id = builder.makeStructType({ uint_type, uint_type, uint_array_type }, "NodeAtomics");
		builder.addDecoration(struct_type_id, spv::DecorationBlock);
		builder.addMemberName(struct_type_id, 0, "payloadCount");
		builder.addMemberName(struct_type_id, 1, "fusedCount");
		builder.addMemberName(struct_type_id, 2, "perNodeTotal");
		builder.addMemberDecoration(struct_type_id, 0, spv::DecorationOffset, 0);
		builder.addMemberDecoration(struct_type_id, 1, spv::DecorationOffset, 4);
		builder.addMemberDecoration(struct_type_id, 2, spv::DecorationOffset, 8);

		auto cast_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, struct_type_id),
		    spv::OpBitcast);
		cast_op->addIdOperand(func->getParamId(0));

		auto chain_payload_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_total_op->addIdOperand(cast_op->getResultId());
		chain_payload_total_op->addIdOperand(builder.makeUintConstant(0));

		auto chain_fused_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_fused_total_op->addIdOperand(cast_op->getResultId());
		chain_fused_total_op->addIdOperand(builder.makeUintConstant(1));

		auto payload_total_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
		payload_total_atomic_op->addIdOperand(chain_payload_total_op->getResultId());
		payload_total_atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		payload_total_atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
		payload_total_atomic_op->addIdOperand(and_op->getResultId());

		spv::Id node_index = func->getParamId(1);

		auto chain_node_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_node_total_op->addIdOperand(cast_op->getResultId());
		chain_node_total_op->addIdOperand(builder.makeUintConstant(2));
		chain_node_total_op->addIdOperand(node_index);

		auto atomic_total_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
		atomic_total_op->addIdOperand(chain_node_total_op->getResultId());
		atomic_total_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_total_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
		atomic_total_op->addIdOperand(total_count_id);

		auto shift_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpShiftLeftLogical);
		shift_op->addIdOperand(node_index);
		shift_op->addIdOperand(builder.makeUintConstant(8));

		auto count_minus_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpISub);
		count_minus_1->addIdOperand(total_count_id);
		count_minus_1->addIdOperand(builder.makeUintConstant(1));

		auto or_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseOr);
		or_op->addIdOperand(shift_op->getResultId());
		or_op->addIdOperand(count_minus_1->getResultId());

		auto fused_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIIncrement);
		fused_atomic_op->addIdOperand(chain_fused_total_op->getResultId());
		fused_atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		fused_atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.

		auto fused_mul2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		fused_mul2->addIdOperand(builder.makeUintConstant(2));
		fused_mul2->addIdOperand(fused_atomic_op->getResultId());

		auto payload_add_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		payload_add_atomic_op->addIdOperand(func->getParamId(4));
		payload_add_atomic_op->addIdOperand(fused_mul2->getResultId());

		auto payload_add_atomic_op_plus_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		payload_add_atomic_op_plus_1->addIdOperand(payload_add_atomic_op->getResultId());
		payload_add_atomic_op_plus_1->addIdOperand(builder.makeUintConstant(1));

		auto chain_payload_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_op->addIdOperand(cast_op->getResultId());
		chain_payload_op->addIdOperand(builder.makeUintConstant(2));
		chain_payload_op->addIdOperand(payload_add_atomic_op->getResultId());

		auto store_payload_inst = std::make_unique<spv::Instruction>(spv::OpStore);
		store_payload_inst->addIdOperand(chain_payload_op->getResultId());
		store_payload_inst->addIdOperand(or_op->getResultId());
		store_payload_inst->addImmediateOperand(spv::MemoryAccessAlignedMask);
		store_payload_inst->addImmediateOperand(8);

		auto chain_payload_op_plus_1 = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_op_plus_1->addIdOperand(cast_op->getResultId());
		chain_payload_op_plus_1->addIdOperand(builder.makeUintConstant(2));
		chain_payload_op_plus_1->addIdOperand(payload_add_atomic_op_plus_1->getResultId());

		auto store_payload_inst_plus_1 = std::make_unique<spv::Instruction>(spv::OpStore);
		store_payload_inst_plus_1->addIdOperand(chain_payload_op_plus_1->getResultId());
		store_payload_inst_plus_1->addIdOperand(payload_total_atomic_op->getResultId());
		store_payload_inst_plus_1->addImmediateOperand(spv::MemoryAccessAlignedMask);
		store_payload_inst_plus_1->addImmediateOperand(4);

		payload_offset_id = payload_total_atomic_op->getResultId();

		add_instruction(body_block, std::move(mul_op));
		add_instruction(body_block, std::move(add_op));
		add_instruction(body_block, std::move(and_op));
		add_instruction(body_block, std::move(cast_op));
		add_instruction(body_block, std::move(chain_payload_total_op));
		add_instruction(body_block, std::move(chain_fused_total_op));
		add_instruction(body_block, std::move(payload_total_atomic_op));
		add_instruction(body_block, std::move(chain_node_total_op));
		add_instruction(body_block, std::move(shift_op));
		add_instruction(body_block, std::move(count_minus_1));
		add_instruction(body_block, std::move(or_op));
		add_instruction(body_block, std::move(fused_atomic_op));
		add_instruction(body_block, std::move(fused_mul2));
		add_instruction(body_block, std::move(atomic_total_op));
		add_instruction(body_block, std::move(payload_add_atomic_op));
		add_instruction(body_block, std::move(payload_add_atomic_op_plus_1));
		add_instruction(body_block, std::move(chain_payload_op));
		add_instruction(body_block, std::move(store_payload_inst));
		add_instruction(body_block, std::move(chain_payload_op_plus_1));
		add_instruction(body_block, std::move(store_payload_inst_plus_1));

		if (!per_thread)
		{
			auto store_inst = std::make_unique<spv::Instruction>(spv::OpStore);
			store_inst->addIdOperand(shared_id);
			store_inst->addIdOperand(payload_offset_id);
			add_instruction(body_block, std::move(store_inst));
		}

		builder.createBranch(merge_block);
	}
	builder.setBuildPoint(merge_block);

	if (!per_thread)
	{
		auto barrier_op = std::make_unique<spv::Instruction>(spv::OpControlBarrier);
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(
		    builder.makeUintConstant(spv::MemorySemanticsAcquireReleaseMask | spv::MemorySemanticsWorkgroupMemoryMask));
		add_instruction(merge_block, std::move(barrier_op));
	}

	spv::Id return_value;

	if (per_thread)
	{
		auto counts_offsets =
		    std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformIAdd);
		counts_offsets->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		counts_offsets->addImmediateOperand(spv::GroupOperationExclusiveScan);
		counts_offsets->addIdOperand(func->getParamId(2));

		auto phi_node = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpPhi);
		phi_node->addIdOperand(payload_offset_id);
		phi_node->addIdOperand(body_block->getId());
		phi_node->addIdOperand(phi_undefined_id);
		phi_node->addIdOperand(reconverge_block->getId());

		auto broadcast_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformBroadcastFirst);
		broadcast_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		broadcast_op->addIdOperand(phi_node->getResultId());

		auto mul_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		mul_op->addIdOperand(counts_offsets->getResultId());
		mul_op->addIdOperand(func->getParamId(3));

		auto add_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		add_op->addIdOperand(broadcast_op->getResultId());
		add_op->addIdOperand(mul_op->getResultId());

		return_value = add_op->getResultId();

		add_instruction(merge_block, std::move(phi_node));
		add_instruction(merge_block, std::move(broadcast_op));
		add_instruction(merge_block, std::move(counts_offsets));
		add_instruction(merge_block, std::move(mul_op));
		add_instruction(merge_block, std::move(add_op));
	}
	else
	{
		auto load_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_op->addIdOperand(shared_id);
		return_value = load_op->getResultId();
		add_instruction(merge_block, std::move(load_op));
	}

	if (!per_thread)
	{
		// Avoid WAR hazard for back-to-back allocations.
		auto barrier_op = std::make_unique<spv::Instruction>(spv::OpControlBarrier);
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(
		    builder.makeUintConstant(spv::MemorySemanticsAcquireReleaseMask | spv::MemorySemanticsWorkgroupMemoryMask));
		add_instruction(merge_block, std::move(barrier_op));
	}

	builder.makeReturn(false, return_value);
	builder.setBuildPoint(current_build_point);
	call_id = func->getId();
	return func->getId();
}